

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

TryEmplaceResult * __thiscall
QHash<std::pair<QFontEngine*,int>,QGlyphRun>::tryEmplace_impl<std::pair<QFontEngine*,int>const&>
          (TryEmplaceResult *__return_storage_ptr__,void *this,pair<QFontEngine_*,_int> *key)

{
  uchar uVar1;
  Span *pSVar2;
  Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> *pDVar3;
  QHashMultiReturnType<QFontEngine_*,_int> hash;
  Node<std::pair<QFontEngine_*,_int>,_QGlyphRun> *pNVar5;
  long in_FS_OFFSET;
  Bucket BVar7;
  QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun> local_40;
  long local_38;
  Span *pSVar4;
  ulong uVar6;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = *this;
  if (pDVar3 == (Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> *)0x0) {
    pDVar3 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_>::
             detached((Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> *)0x0);
    *(Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> **)this = pDVar3;
  }
  local_40.d = (Data *)0x0;
  hash = qHashMulti<QFontEngine*,int>(pDVar3->seed,&key->first,&key->second);
  BVar7 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QFontEngine*,int>,QGlyphRun>>::
          findBucketWithHash<std::pair<QFontEngine*,int>>(*this,key,hash);
  uVar6 = BVar7.index;
  pSVar4 = BVar7.span;
  uVar1 = pSVar4->offsets[uVar6];
  pDVar3 = *this;
  if ((pDVar3 == (Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> *)0x0) ||
     (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun>::operator=
              (&local_40,(QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun> *)this);
    if (uVar1 == 0xff) {
LAB_005267bc:
      pDVar3 = *this;
      if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
        pDVar3 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_>::
                 detached(pDVar3,pDVar3->size + 1);
        *(Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> **)this = pDVar3;
        BVar7 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QFontEngine*,int>,QGlyphRun>>::
                findBucketWithHash<std::pair<QFontEngine*,int>>
                          ((Data<QHashPrivate::Node<std::pair<QFontEngine*,int>,QGlyphRun>> *)pDVar3
                           ,key,hash);
        goto LAB_00526839;
      }
    }
    else {
      pDVar3 = *this;
    }
    pSVar2 = pDVar3->spans;
    pDVar3 = QHashPrivate::Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_>::
             detached(pDVar3);
    *(Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> **)this = pDVar3;
    BVar7.index._0_4_ = (uint)BVar7.index & 0x7f;
    BVar7.span = pDVar3->spans +
                 ((((ulong)((long)pSVar4 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar6) >> 7);
    BVar7.index._4_4_ = 0;
    if (uVar1 != 0xff) goto LAB_00526861;
  }
  else {
    if (uVar1 != 0xff) goto LAB_00526861;
    if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
      QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun>::operator=
                (&local_40,(QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun> *)this);
      goto LAB_005267bc;
    }
  }
LAB_00526839:
  pNVar5 = QHashPrivate::Span<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_>::insert
                     (BVar7.span,BVar7.index);
  (pNVar5->key).first = key->first;
  (pNVar5->key).second = key->second;
  QGlyphRun::QGlyphRun(&pNVar5->value);
  pDVar3 = *this;
  pDVar3->size = pDVar3->size + 1;
LAB_00526861:
  pSVar4 = pDVar3->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar3;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar7.span - (long)pSVar4) >> 4) * 0x1c71c71c71c71c80 | BVar7.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }